

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::ConsumerIPCService::RemoteConsumer::OnTraceStats
          (RemoteConsumer *this,bool success,TraceStats *stats)

{
  pointer *__ptr;
  undefined7 in_register_00000031;
  AsyncResult<perfetto::protos::gen::GetTraceStatsResponse> response;
  AsyncResult<perfetto::protos::gen::GetTraceStatsResponse> local_38;
  __uniq_ptr_impl<perfetto::protos::gen::GetTraceStatsResponse,_std::default_delete<perfetto::protos::gen::GetTraceStatsResponse>_>
  local_28;
  bool bStack_20;
  undefined3 uStack_1f;
  int iStack_1c;
  
  if ((int)CONCAT71(in_register_00000031,success) != 0) {
    ipc::AsyncResult<perfetto::protos::gen::GetTraceStatsResponse>::Create();
    *(ulong *)((long)local_28._M_t.
                     super__Tuple_impl<0UL,_perfetto::protos::gen::GetTraceStatsResponse_*,_std::default_delete<perfetto::protos::gen::GetTraceStatsResponse>_>
                     .super__Head_base<0UL,_perfetto::protos::gen::GetTraceStatsResponse_*,_false>.
                     _M_head_impl + 0x30) =
         *(ulong *)((long)local_28._M_t.
                          super__Tuple_impl<0UL,_perfetto::protos::gen::GetTraceStatsResponse_*,_std::default_delete<perfetto::protos::gen::GetTraceStatsResponse>_>
                          .
                          super__Head_base<0UL,_perfetto::protos::gen::GetTraceStatsResponse_*,_false>
                          ._M_head_impl + 0x30) | 2;
    protos::gen::TraceStats::operator=
              (*(TraceStats **)
                ((long)local_28._M_t.
                       super__Tuple_impl<0UL,_perfetto::protos::gen::GetTraceStatsResponse_*,_std::default_delete<perfetto::protos::gen::GetTraceStatsResponse>_>
                       .super__Head_base<0UL,_perfetto::protos::gen::GetTraceStatsResponse_*,_false>
                       ._M_head_impl + 8),stats);
    local_38.msg_._M_t.
    super___uniq_ptr_impl<perfetto::protos::gen::GetTraceStatsResponse,_std::default_delete<perfetto::protos::gen::GetTraceStatsResponse>_>
    ._M_t.
    super__Tuple_impl<0UL,_perfetto::protos::gen::GetTraceStatsResponse_*,_std::default_delete<perfetto::protos::gen::GetTraceStatsResponse>_>
    .super__Head_base<0UL,_perfetto::protos::gen::GetTraceStatsResponse_*,_false>._M_head_impl =
         (__uniq_ptr_data<perfetto::protos::gen::GetTraceStatsResponse,_std::default_delete<perfetto::protos::gen::GetTraceStatsResponse>,_true,_true>
          )(__uniq_ptr_data<perfetto::protos::gen::GetTraceStatsResponse,_std::default_delete<perfetto::protos::gen::GetTraceStatsResponse>,_true,_true>
            )local_28._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::GetTraceStatsResponse_*,_std::default_delete<perfetto::protos::gen::GetTraceStatsResponse>_>
             .super__Head_base<0UL,_perfetto::protos::gen::GetTraceStatsResponse_*,_false>.
             _M_head_impl;
    local_38.has_more_ = bStack_20;
    local_38._9_3_ = uStack_1f;
    local_38.fd_ = iStack_1c;
    local_28._M_t.
    super__Tuple_impl<0UL,_perfetto::protos::gen::GetTraceStatsResponse_*,_std::default_delete<perfetto::protos::gen::GetTraceStatsResponse>_>
    .super__Head_base<0UL,_perfetto::protos::gen::GetTraceStatsResponse_*,_false>._M_head_impl =
         (tuple<perfetto::protos::gen::GetTraceStatsResponse_*,_std::default_delete<perfetto::protos::gen::GetTraceStatsResponse>_>
          )(_Tuple_impl<0UL,_perfetto::protos::gen::GetTraceStatsResponse_*,_std::default_delete<perfetto::protos::gen::GetTraceStatsResponse>_>
            )0x0;
    ipc::Deferred<perfetto::protos::gen::GetTraceStatsResponse>::Resolve
              (&this->get_trace_stats_response,&local_38);
    if ((_Head_base<0UL,_perfetto::protos::gen::GetTraceStatsResponse_*,_false>)
        local_38.msg_._M_t.
        super___uniq_ptr_impl<perfetto::protos::gen::GetTraceStatsResponse,_std::default_delete<perfetto::protos::gen::GetTraceStatsResponse>_>
        ._M_t.
        super__Tuple_impl<0UL,_perfetto::protos::gen::GetTraceStatsResponse_*,_std::default_delete<perfetto::protos::gen::GetTraceStatsResponse>_>
        .super__Head_base<0UL,_perfetto::protos::gen::GetTraceStatsResponse_*,_false>._M_head_impl
        != (_Head_base<0UL,_perfetto::protos::gen::GetTraceStatsResponse_*,_false>)0x0) {
      (*((CppMessageObj *)
        local_38.msg_._M_t.
        super___uniq_ptr_impl<perfetto::protos::gen::GetTraceStatsResponse,_std::default_delete<perfetto::protos::gen::GetTraceStatsResponse>_>
        ._M_t.
        super__Tuple_impl<0UL,_perfetto::protos::gen::GetTraceStatsResponse_*,_std::default_delete<perfetto::protos::gen::GetTraceStatsResponse>_>
        .super__Head_base<0UL,_perfetto::protos::gen::GetTraceStatsResponse_*,_false>._M_head_impl)
        ->_vptr_CppMessageObj[1])();
    }
    local_38.msg_._M_t.
    super___uniq_ptr_impl<perfetto::protos::gen::GetTraceStatsResponse,_std::default_delete<perfetto::protos::gen::GetTraceStatsResponse>_>
    ._M_t.
    super__Tuple_impl<0UL,_perfetto::protos::gen::GetTraceStatsResponse_*,_std::default_delete<perfetto::protos::gen::GetTraceStatsResponse>_>
    .super__Head_base<0UL,_perfetto::protos::gen::GetTraceStatsResponse_*,_false>._M_head_impl =
         (__uniq_ptr_data<perfetto::protos::gen::GetTraceStatsResponse,_std::default_delete<perfetto::protos::gen::GetTraceStatsResponse>,_true,_true>
          )(__uniq_ptr_impl<perfetto::protos::gen::GetTraceStatsResponse,_std::default_delete<perfetto::protos::gen::GetTraceStatsResponse>_>
            )0x0;
    if (local_28._M_t.
        super__Tuple_impl<0UL,_perfetto::protos::gen::GetTraceStatsResponse_*,_std::default_delete<perfetto::protos::gen::GetTraceStatsResponse>_>
        .super__Head_base<0UL,_perfetto::protos::gen::GetTraceStatsResponse_*,_false>._M_head_impl
        != (_Tuple_impl<0UL,_perfetto::protos::gen::GetTraceStatsResponse_*,_std::default_delete<perfetto::protos::gen::GetTraceStatsResponse>_>
            )0x0) {
      (**(code **)(*(long *)local_28._M_t.
                            super__Tuple_impl<0UL,_perfetto::protos::gen::GetTraceStatsResponse_*,_std::default_delete<perfetto::protos::gen::GetTraceStatsResponse>_>
                            .
                            super__Head_base<0UL,_perfetto::protos::gen::GetTraceStatsResponse_*,_false>
                            ._M_head_impl + 8))();
    }
    return;
  }
  ipc::DeferredBase::Reject(&(this->get_trace_stats_response).super_DeferredBase);
  return;
}

Assistant:

void ConsumerIPCService::RemoteConsumer::OnTraceStats(bool success,
                                                      const TraceStats& stats) {
  if (!success) {
    std::move(get_trace_stats_response).Reject();
    return;
  }
  auto response =
      ipc::AsyncResult<protos::gen::GetTraceStatsResponse>::Create();
  *response->mutable_trace_stats() = stats;
  std::move(get_trace_stats_response).Resolve(std::move(response));
}